

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

NamedVar * __thiscall
despot::Parser::CreateRewardVar
          (NamedVar *__return_storage_ptr__,Parser *this,TiXmlElement *e_RewardVar)

{
  char *__s;
  allocator<char> local_99;
  value_type local_98;
  undefined1 local_78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rewardEnum;
  allocator<char> local_49;
  string local_48;
  byte local_21;
  TiXmlElement *local_20;
  TiXmlElement *e_RewardVar_local;
  Parser *this_local;
  NamedVar *rew;
  
  local_21 = 0;
  local_20 = e_RewardVar;
  e_RewardVar_local = (TiXmlElement *)this;
  this_local = (Parser *)__return_storage_ptr__;
  __s = util::tinyxml::TiXmlElement::Attribute(e_RewardVar,"vname");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s,&local_49);
  NamedVar::NamedVar(__return_storage_ptr__,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"rew",&local_99);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  Variable::values(&__return_storage_ptr__->super_Variable,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_78);
  local_21 = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_78);
  if ((local_21 & 1) == 0) {
    NamedVar::~NamedVar(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

RewardVar Parser::CreateRewardVar(TiXmlElement* e_RewardVar) {
	RewardVar rew(e_RewardVar->Attribute("vname"));

	vector<string> rewardEnum;
	rewardEnum.push_back(REWARD_VAR_VALUE);
	rew.values(rewardEnum);

	return rew;
}